

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_fixed.cc
# Opt level: O0

bool absl::time_internal::cctz::FixedOffsetFromName(string *name,seconds *offset)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  duration<long,_std::ratio<1L,_1L>_> dVar5;
  size_type sVar6;
  const_iterator __first2;
  char *pcVar7;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  int secs;
  int mins;
  int hours;
  char *np;
  char *ep;
  size_t prefix_len;
  seconds *offset_local;
  string *name_local;
  
  bVar1 = std::operator==(in_stack_ffffffffffffffa0,
                          (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if ((bVar1) ||
     (bVar1 = std::operator==(in_stack_ffffffffffffffa0,
                              (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98))
     , bVar1)) {
    dVar5 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::zero();
    offset->__r = dVar5.__r;
    name_local._7_1_ = true;
  }
  else {
    sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (name);
    if (sVar6 == 0x12) {
      __first2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      bVar1 = std::equal<char_const*,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        ("Fixed/UTC","",
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )__first2._M_current);
      if (bVar1) {
        pcVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 data((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1ec8a0)
        ;
        if ((pcVar7[9] == '+') || (pcVar7[9] == '-')) {
          if ((pcVar7[0xc] == ':') && (pcVar7[0xf] == ':')) {
            iVar2 = anon_unknown_0::Parse02d(pcVar7 + 10);
            if (iVar2 == -1) {
              name_local._7_1_ = false;
            }
            else {
              iVar3 = anon_unknown_0::Parse02d(pcVar7 + 0xd);
              if (iVar3 == -1) {
                name_local._7_1_ = false;
              }
              else {
                iVar4 = anon_unknown_0::Parse02d(pcVar7 + 0x10);
                if (iVar4 == -1) {
                  name_local._7_1_ = false;
                }
                else if ((iVar2 * 0x3c + iVar3) * 0x3c + iVar4 < 0x15181) {
                  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                            ((duration<long,std::ratio<1l,1l>> *)&stack0xffffffffffffffa0,
                             (int *)&stack0xffffffffffffff9c);
                  offset->__r = (rep)in_stack_ffffffffffffffa0;
                  name_local._7_1_ = true;
                }
                else {
                  name_local._7_1_ = false;
                }
              }
            }
          }
          else {
            name_local._7_1_ = false;
          }
        }
        else {
          name_local._7_1_ = false;
        }
      }
      else {
        name_local._7_1_ = false;
      }
    }
    else {
      name_local._7_1_ = false;
    }
  }
  return name_local._7_1_;
}

Assistant:

bool FixedOffsetFromName(const std::string& name, seconds* offset) {
  if (name == "UTC" || name == "UTC0") {
    *offset = seconds::zero();
    return true;
  }

  const std::size_t prefix_len = sizeof(kFixedZonePrefix) - 1;
  const char* const ep = kFixedZonePrefix + prefix_len;
  if (name.size() != prefix_len + 9)  // <prefix>+99:99:99
    return false;
  if (!std::equal(kFixedZonePrefix, ep, name.begin())) return false;
  const char* np = name.data() + prefix_len;
  if (np[0] != '+' && np[0] != '-') return false;
  if (np[3] != ':' || np[6] != ':')  // see note below about large offsets
    return false;

  int hours = Parse02d(np + 1);
  if (hours == -1) return false;
  int mins = Parse02d(np + 4);
  if (mins == -1) return false;
  int secs = Parse02d(np + 7);
  if (secs == -1) return false;

  secs += ((hours * 60) + mins) * 60;
  if (secs > 24 * 60 * 60) return false;  // outside supported offset range
  *offset = seconds(secs * (np[0] == '-' ? -1 : 1));  // "-" means west
  return true;
}